

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  attributeDeclSAXFunc p_Var2;
  xmlChar *value;
  int iVar3;
  int iVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlChar *fullattr;
  xmlParserErrors code;
  xmlEnumerationPtr tree;
  xmlChar *defaultValue;
  char *pcVar7;
  xmlEnumerationPtr local_48;
  int local_3c;
  xmlChar *local_38;
  
  pxVar1 = ctxt->input;
  pxVar6 = pxVar1->cur;
  if ((*pxVar6 == '<') && (pxVar6[1] == '!')) {
    pxVar1->cur = pxVar6 + 2;
    pxVar1->col = pxVar1->col + 2;
    if (pxVar6[2] == '\0') {
      xmlParserGrow(ctxt);
    }
    pxVar1 = ctxt->input;
    pxVar6 = pxVar1->cur;
    if ((((*pxVar6 == 'A') && (pxVar6[1] == 'T')) && (pxVar6[2] == 'T')) &&
       (((pxVar6[3] == 'L' && (pxVar6[4] == 'I')) && ((pxVar6[5] == 'S' && (pxVar6[6] == 'T')))))) {
      local_3c = pxVar1->id;
      pxVar1->cur = pxVar6 + 7;
      pxVar1->col = pxVar1->col + 7;
      if (pxVar6[7] == '\0') {
        xmlParserGrow(ctxt);
      }
      iVar3 = xmlSkipBlankCharsPE(ctxt);
      if (iVar3 == 0) {
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                   "Space required after \'<!ATTLIST\'\n");
      }
      pxVar6 = xmlParseName(ctxt);
      if (pxVar6 != (xmlChar *)0x0) {
        xmlSkipBlankCharsPE(ctxt);
        do {
          pxVar1 = ctxt->input;
          if (((pxVar1->flags & 0x40) == 0) && ((long)pxVar1->end - (long)pxVar1->cur < 0xfa)) {
            xmlParserGrow(ctxt);
          }
          pxVar1 = ctxt->input;
          if ((*pxVar1->cur == '>') || (1 < ctxt->disableSAX)) goto LAB_00138692;
          local_38 = (xmlChar *)0x0;
          if (((pxVar1->flags & 0x40) == 0) && ((long)pxVar1->end - (long)pxVar1->cur < 0xfa)) {
            xmlParserGrow(ctxt);
          }
          local_48 = (xmlEnumerationPtr)0x0;
          fullattr = xmlParseName(ctxt);
          if (fullattr == (xmlChar *)0x0) {
            pcVar7 = "ATTLIST: no name for Attribute\n";
            code = XML_ERR_NAME_REQUIRED;
LAB_001385cf:
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,(xmlChar *)0x0,
                       (xmlChar *)0x0,(xmlChar *)0x0,0,"%s",pcVar7);
            goto LAB_00138692;
          }
          pxVar1 = ctxt->input;
          if (((pxVar1->flags & 0x40) == 0) && ((long)pxVar1->end - (long)pxVar1->cur < 0xfa)) {
            xmlParserGrow(ctxt);
          }
          iVar3 = xmlSkipBlankCharsPE(ctxt);
          if (iVar3 == 0) {
            pcVar7 = "Space required after the attribute name\n";
            code = XML_ERR_SPACE_REQUIRED;
            goto LAB_001385cf;
          }
          iVar3 = xmlParseAttributeType(ctxt,&local_48);
          if (iVar3 < 1) goto LAB_00138692;
          pxVar1 = ctxt->input;
          if (((pxVar1->flags & 0x40) == 0) && ((long)pxVar1->end - (long)pxVar1->cur < 0xfa)) {
            xmlParserGrow(ctxt);
          }
          iVar4 = xmlSkipBlankCharsPE(ctxt);
          if (iVar4 == 0) {
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
                       (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                       "Space required after the attribute type\n");
            goto LAB_00138683;
          }
          iVar4 = xmlParseDefaultDecl(ctxt,&local_38);
          value = local_38;
          if (local_38 != (xmlChar *)0x0 && iVar3 != 1) {
            xmlAttrNormalizeSpace(local_38,local_38);
          }
          pxVar1 = ctxt->input;
          if (((pxVar1->flags & 0x40) == 0) && ((long)pxVar1->end - (long)pxVar1->cur < 0xfa)) {
            xmlParserGrow(ctxt);
          }
          if ((*ctxt->input->cur != '>') && (iVar5 = xmlSkipBlankCharsPE(ctxt), iVar5 == 0)) {
            xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
                       (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                       "Space required after the attribute default value\n");
            if (value != (xmlChar *)0x0) {
              (*xmlFree)(value);
            }
LAB_00138683:
            if (local_48 != (xmlEnumerationPtr)0x0) {
              xmlFreeEnumeration(local_48);
            }
LAB_00138692:
            if (*ctxt->input->cur != '>') {
              return;
            }
            if (local_3c != ctxt->input->id) {
              xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
                         (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                         "Attribute list declaration doesn\'t start and stop in the same entity\n");
            }
            xmlNextChar(ctxt);
            return;
          }
          if (((ctxt->sax == (_xmlSAXHandler *)0x0) || (ctxt->disableSAX != 0)) ||
             (p_Var2 = ctxt->sax->attributeDecl, p_Var2 == (attributeDeclSAXFunc)0x0)) {
            if (local_48 != (xmlEnumerationPtr)0x0) {
              xmlFreeEnumeration(local_48);
            }
          }
          else {
            (*p_Var2)(ctxt->userData,pxVar6,fullattr,iVar3,iVar4,value,local_48);
          }
          if (iVar4 - 4U < 0xfffffffe && (ctxt->sax2 != 0 && value != (xmlChar *)0x0)) {
            xmlAddDefAttrs(ctxt,pxVar6,fullattr,value);
          }
          if (ctxt->sax2 != 0) {
            xmlAddSpecialAttr(ctxt,pxVar6,fullattr,iVar3);
          }
          if (value != (xmlChar *)0x0) {
            (*xmlFree)(value);
          }
        } while( true );
      }
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_NAME_REQUIRED,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                 "ATTLIST: no name for Element\n");
    }
  }
  return;
}

Assistant:

void
xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *elemName;
    const xmlChar *attrName;
    xmlEnumerationPtr tree;

    if ((CUR != '<') || (NXT(1) != '!'))
        return;
    SKIP(2);

    if (CMP7(CUR_PTR, 'A', 'T', 'T', 'L', 'I', 'S', 'T')) {
	int inputid = ctxt->input->id;

	SKIP(7);
	if (SKIP_BLANKS_PE == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		                 "Space required after '<!ATTLIST'\n");
	}
        elemName = xmlParseName(ctxt);
	if (elemName == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "ATTLIST: no name for Element\n");
	    return;
	}
	SKIP_BLANKS_PE;
	GROW;
	while ((RAW != '>') && (PARSER_STOPPED(ctxt) == 0)) {
	    int type;
	    int def;
	    xmlChar *defaultValue = NULL;

	    GROW;
            tree = NULL;
	    attrName = xmlParseName(ctxt);
	    if (attrName == NULL) {
		xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			       "ATTLIST: no name for Attribute\n");
		break;
	    }
	    GROW;
	    if (SKIP_BLANKS_PE == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		        "Space required after the attribute name\n");
		break;
	    }

	    type = xmlParseAttributeType(ctxt, &tree);
	    if (type <= 0) {
	        break;
	    }

	    GROW;
	    if (SKIP_BLANKS_PE == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			       "Space required after the attribute type\n");
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
		break;
	    }

	    def = xmlParseDefaultDecl(ctxt, &defaultValue);
	    if (def <= 0) {
                if (defaultValue != NULL)
		    xmlFree(defaultValue);
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
	        break;
	    }
	    if ((type != XML_ATTRIBUTE_CDATA) && (defaultValue != NULL))
	        xmlAttrNormalizeSpace(defaultValue, defaultValue);

	    GROW;
            if (RAW != '>') {
		if (SKIP_BLANKS_PE == 0) {
		    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			"Space required after the attribute default value\n");
		    if (defaultValue != NULL)
			xmlFree(defaultValue);
		    if (tree != NULL)
			xmlFreeEnumeration(tree);
		    break;
		}
	    }
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->attributeDecl != NULL))
		ctxt->sax->attributeDecl(ctxt->userData, elemName, attrName,
	                        type, def, defaultValue, tree);
	    else if (tree != NULL)
		xmlFreeEnumeration(tree);

	    if ((ctxt->sax2) && (defaultValue != NULL) &&
	        (def != XML_ATTRIBUTE_IMPLIED) &&
		(def != XML_ATTRIBUTE_REQUIRED)) {
		xmlAddDefAttrs(ctxt, elemName, attrName, defaultValue);
	    }
	    if (ctxt->sax2) {
		xmlAddSpecialAttr(ctxt, elemName, attrName, type);
	    }
	    if (defaultValue != NULL)
	        xmlFree(defaultValue);
	    GROW;
	}
	if (RAW == '>') {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Attribute list declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    NEXT;
	}
    }
}